

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O3

void __thiscall cmMakefile::StoreMatches(cmMakefile *this,RegularExpression *re)

{
  long lVar1;
  int iVar2;
  string *name;
  char nMatches [2];
  StackIter local_60;
  StackIter local_58;
  _List_iterator<cmDefinitions> local_50;
  long local_48;
  _List_node_base local_40;
  
  lVar1 = -10;
  name = matchVariables_abi_cxx11_;
  iVar2 = 0;
  do {
    if (re->endp[lVar1] != (char *)0x0) {
      local_50._M_node = &local_40;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,re->endp[lVar1],re->endp[lVar1 + 10]);
      if (local_48 != 0) {
        AddDefinition(this,name,(char *)local_50._M_node);
        local_58.current._M_node = (_List_iterator<cmDefinitions>)(this->Internal).x_;
        local_60.current._M_node =
             (_List_iterator<cmDefinitions>)
             (((list<cmDefinitions,_std::allocator<cmDefinitions>_> *)
              &((_List_node_base *)local_58.current._M_node)->_M_next)->
             super__List_base<cmDefinitions,_std::allocator<cmDefinitions>_>)._M_impl._M_node.
             super__List_node_base._M_next;
        cmDefinitions::Get(name,&local_58,&local_60);
        iVar2 = (int)lVar1 + 0x3a;
      }
      if (local_50._M_node != &local_40) {
        operator_delete(local_50._M_node,(ulong)((long)&(local_40._M_next)->_M_next + 1));
      }
    }
    name = name + 1;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0);
  local_60.current._M_node._0_2_ = (ushort)(byte)iVar2;
  AddDefinition(this,&nMatchesVariable_abi_cxx11_,(char *)&local_60);
  local_50._M_node = (_List_node_base *)(this->Internal).x_;
  local_58.current._M_node =
       (_List_iterator<cmDefinitions>)
       (((Internals *)local_50._M_node)->VarStack).
       super__List_base<cmDefinitions,_std::allocator<cmDefinitions>_>._M_impl._M_node.
       super__List_node_base._M_next;
  cmDefinitions::Get(&nMatchesVariable_abi_cxx11_,(StackIter *)&local_50,&local_58);
  return;
}

Assistant:

void cmMakefile::StoreMatches(cmsys::RegularExpression& re)
{
  char highest = 0;
  for (int i=0; i<10; i++)
    {
    std::string const& m = re.match(i);
    if(!m.empty())
      {
      std::string const& var = matchVariables[i];
      this->AddDefinition(var, m.c_str());
      this->MarkVariableAsUsed(var);
      highest = static_cast<char>('0' + i);
      }
    }
  char nMatches[] = {highest, '\0'};
  this->AddDefinition(nMatchesVariable, nMatches);
  this->MarkVariableAsUsed(nMatchesVariable);
}